

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

size_t create_dnscache_id(char *name,size_t nlen,int port,char *ptr,size_t buflen)

{
  int iVar1;
  ulong local_40;
  ulong local_38;
  size_t len;
  size_t buflen_local;
  char *ptr_local;
  int port_local;
  size_t nlen_local;
  char *name_local;
  
  local_40 = nlen;
  if (nlen == 0) {
    local_40 = strlen(name);
  }
  local_38 = local_40;
  if (buflen - 7 < local_40) {
    local_38 = buflen - 7;
  }
  Curl_strntolower(ptr,name,local_38);
  iVar1 = curl_msnprintf(ptr + local_38,7,":%u",(ulong)(uint)port);
  return (long)iVar1 + local_38;
}

Assistant:

static size_t
create_dnscache_id(const char *name,
                   size_t nlen, /* 0 or actual name length */
                   int port, char *ptr, size_t buflen)
{
  size_t len = nlen ? nlen : strlen(name);
  DEBUGASSERT(buflen >= MAX_HOSTCACHE_LEN);
  if(len > (buflen - 7))
    len = buflen - 7;
  /* store and lower case the name */
  Curl_strntolower(ptr, name, len);
  return msnprintf(&ptr[len], 7, ":%u", port) + len;
}